

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void omp_init_lock_with_hint_(void **user_lock,uintptr_t *hint)

{
  int iVar1;
  int gtid;
  void *unaff_retaddr;
  uintptr_t in_stack_00000068;
  void **in_stack_00000070;
  kmp_int32 in_stack_0000007c;
  ident_t *in_stack_00000080;
  
  iVar1 = __kmp_get_global_thread_id_reg();
  if ((((((ulong)ompt_enabled & 1) != 0) && (-1 < iVar1)) &&
      (__kmp_threads[iVar1] != (kmp_info_t *)0x0)) &&
     ((__kmp_threads[iVar1]->th).ompt_thread_info.return_address == (void *)0x0)) {
    (__kmp_threads[iVar1]->th).ompt_thread_info.return_address = unaff_retaddr;
  }
  __kmpc_init_lock_with_hint
            (in_stack_00000080,in_stack_0000007c,in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

void FTN_STDCALL FTN_INIT_LOCK_WITH_HINT(void **user_lock,
                                         uintptr_t KMP_DEREF hint) {
#ifdef KMP_STUB
  *((kmp_stub_lock_t *)user_lock) = UNLOCKED;
#else
  int gtid = __kmp_entry_gtid();
#if OMPT_SUPPORT && OMPT_OPTIONAL
  OMPT_STORE_RETURN_ADDRESS(gtid);
#endif
  __kmpc_init_lock_with_hint(NULL, gtid, user_lock, KMP_DEREF hint);
#endif
}